

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::FieldGeneratorMap::FieldGeneratorMap
          (FieldGeneratorMap *this,Descriptor *descriptor,Options *options,
          MessageSCCAnalyzer *scc_analyzer)

{
  pointer puVar1;
  __uniq_ptr_impl<google::protobuf::compiler::cpp::FieldGenerator,_std::default_delete<google::protobuf::compiler::cpp::FieldGenerator>_>
  _Var2;
  __uniq_ptr_impl<google::protobuf::compiler::cpp::FieldGenerator,_std::default_delete<google::protobuf::compiler::cpp::FieldGenerator>_>
  _Var3;
  long lVar4;
  long lVar5;
  allocator_type local_39;
  MessageSCCAnalyzer *local_38;
  
  this->descriptor_ = descriptor;
  local_38 = scc_analyzer;
  std::
  vector<std::unique_ptr<google::protobuf::compiler::cpp::FieldGenerator,_std::default_delete<google::protobuf::compiler::cpp::FieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::FieldGenerator,_std::default_delete<google::protobuf::compiler::cpp::FieldGenerator>_>_>_>
  ::vector(&this->field_generators_,(long)*(int *)(descriptor + 4),&local_39);
  if (0 < *(int *)(descriptor + 4)) {
    lVar5 = 0;
    lVar4 = 0;
    do {
      puVar1 = (this->field_generators_).
               super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::FieldGenerator,_std::default_delete<google::protobuf::compiler::cpp::FieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::FieldGenerator,_std::default_delete<google::protobuf::compiler::cpp::FieldGenerator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      _Var3._M_t.
      super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::FieldGenerator_*,_std::default_delete<google::protobuf::compiler::cpp::FieldGenerator>_>
      .super__Head_base<0UL,_google::protobuf::compiler::cpp::FieldGenerator_*,_false>._M_head_impl
           = (tuple<google::protobuf::compiler::cpp::FieldGenerator_*,_std::default_delete<google::protobuf::compiler::cpp::FieldGenerator>_>
              )MakeGenerator((FieldDescriptor *)(*(long *)(descriptor + 0x28) + lVar5),options,
                             local_38);
      _Var2._M_t.
      super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::FieldGenerator_*,_std::default_delete<google::protobuf::compiler::cpp::FieldGenerator>_>
      .super__Head_base<0UL,_google::protobuf::compiler::cpp::FieldGenerator_*,_false>._M_head_impl
           = puVar1[lVar4]._M_t.
             super___uniq_ptr_impl<google::protobuf::compiler::cpp::FieldGenerator,_std::default_delete<google::protobuf::compiler::cpp::FieldGenerator>_>
             ._M_t;
      puVar1[lVar4]._M_t.
      super___uniq_ptr_impl<google::protobuf::compiler::cpp::FieldGenerator,_std::default_delete<google::protobuf::compiler::cpp::FieldGenerator>_>
      ._M_t = _Var3._M_t.
              super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::FieldGenerator_*,_std::default_delete<google::protobuf::compiler::cpp::FieldGenerator>_>
              .super__Head_base<0UL,_google::protobuf::compiler::cpp::FieldGenerator_*,_false>.
              _M_head_impl;
      if ((_Tuple_impl<0UL,_google::protobuf::compiler::cpp::FieldGenerator_*,_std::default_delete<google::protobuf::compiler::cpp::FieldGenerator>_>
           )_Var2._M_t.
            super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::FieldGenerator_*,_std::default_delete<google::protobuf::compiler::cpp::FieldGenerator>_>
            .super__Head_base<0UL,_google::protobuf::compiler::cpp::FieldGenerator_*,_false>.
            _M_head_impl != (FieldGenerator *)0x0) {
        (**(code **)(*(long *)_Var2._M_t.
                              super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::FieldGenerator_*,_std::default_delete<google::protobuf::compiler::cpp::FieldGenerator>_>
                              .
                              super__Head_base<0UL,_google::protobuf::compiler::cpp::FieldGenerator_*,_false>
                              ._M_head_impl + 8))();
      }
      lVar4 = lVar4 + 1;
      lVar5 = lVar5 + 0x48;
    } while (lVar4 < *(int *)(descriptor + 4));
  }
  return;
}

Assistant:

FieldGeneratorMap::FieldGeneratorMap(const Descriptor* descriptor,
                                     const Options& options,
                                     MessageSCCAnalyzer* scc_analyzer)
    : descriptor_(descriptor), field_generators_(descriptor->field_count()) {
  // Construct all the FieldGenerators.
  for (int i = 0; i < descriptor->field_count(); i++) {
    field_generators_[i].reset(
        MakeGenerator(descriptor->field(i), options, scc_analyzer));
  }
}